

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 556_reverseWordsInAString.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  string local_80;
  string local_60;
  allocator<char> local_29;
  string local_28 [8];
  string s;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_28,"Let\'s take LeetCode contest",&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::__cxx11::string::string((string *)&local_80,local_28);
  reverseWords(&local_60,&local_80);
  this = std::operator<<((ostream *)&std::cout,(string *)&local_60);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int main()
{
	string s="Let's take LeetCode contest";
	cout<<reverseWords(s)<<endl;
}